

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O3

void stbir__decode_scanline(stbir__info *stbir_info,int n)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  stbir_edge sVar4;
  stbir_datatype sVar5;
  float *pfVar6;
  void *pvVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  float *pfVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  float fVar24;
  int max2_3;
  
  uVar1 = stbir_info->channels;
  lVar20 = (long)(int)uVar1;
  uVar2 = stbir_info->alpha_channel;
  lVar9 = (long)(int)uVar2;
  iVar22 = stbir_info->input_w;
  iVar21 = stbir_info->input_h;
  pfVar6 = stbir_info->decode_buffer;
  iVar3 = stbir_info->horizontal_filter_pixel_margin;
  sVar4 = stbir_info->edge_horizontal;
  iVar16 = n;
  if (iVar21 <= n || n < 0) {
    iVar16 = 0;
    switch(stbir_info->edge_vertical) {
    case STBIR_EDGE_CLAMP:
      if ((-1 < n) && (iVar16 = iVar21 + -1, n < iVar21)) {
        iVar16 = n;
      }
      break;
    case STBIR_EDGE_REFLECT:
      if (n < 0) {
        if (n < iVar21) {
          iVar16 = -n;
        }
        else {
          iVar16 = iVar21 + -1;
        }
      }
      else {
        iVar16 = n;
        if (iVar21 <= n) {
          iVar16 = ~n + iVar21 * 2;
          if (iVar21 * 2 <= n) {
            iVar16 = 0;
          }
        }
      }
      break;
    case STBIR_EDGE_WRAP:
      iVar8 = n % iVar21;
      iVar16 = iVar8;
      if ((n < 0) && (iVar16 = iVar21 + iVar8, iVar8 == 0)) {
        iVar16 = iVar8;
      }
      break;
    case STBIR_EDGE_ZERO:
      break;
    default:
switchD_001380aa_default:
      __assert_fail("!\"Unimplemented edge type\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                    ,0x3e3,"int stbir__edge_wrap_slow(stbir_edge, int, int)");
    }
  }
  uVar14 = (ulong)uVar1;
  lVar19 = (long)(int)(iVar3 * uVar1);
  iVar18 = iVar22 + iVar3;
  iVar8 = -iVar3;
  if (stbir_info->edge_vertical == STBIR_EDGE_ZERO && (iVar21 <= n || n < 0)) {
    if (iVar18 != iVar8 && SBORROW4(iVar18,iVar8) == iVar18 + iVar3 < 0) {
      iVar22 = iVar22 + iVar3 * 2;
      iVar21 = -(iVar3 * uVar1);
      do {
        if (0 < (int)uVar1) {
          memset(pfVar6 + lVar19 + iVar21,0,uVar14 << 2);
        }
        iVar21 = iVar21 + uVar1;
        iVar22 = iVar22 + -1;
      } while (iVar22 != 0);
    }
  }
  else {
    uVar10 = stbir_info->colorspace + stbir_info->type * 2;
    if (7 < uVar10) {
      __assert_fail("!\"Unknown type/colorspace/channels combination.\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                    ,0x559,"void stbir__decode_scanline(stbir__info *, int)");
    }
    lVar13 = (long)iVar16 * (long)stbir_info->input_stride_bytes;
    pvVar7 = stbir_info->input_data;
    lVar11 = (long)iVar22;
    switch(uVar10) {
    case 0:
      if (iVar18 != iVar8 && SBORROW4(iVar18,iVar8) == iVar18 + iVar3 < 0) {
        uVar17 = (ulong)iVar8;
        pfVar15 = pfVar6 + lVar20 * uVar17 + lVar19;
        do {
          uVar10 = (uint)uVar17;
          if ((long)uVar17 < 0 || lVar11 <= (long)uVar17) {
            switch(sVar4) {
            case STBIR_EDGE_CLAMP:
              uVar12 = iVar22 - 1U;
              if ((long)uVar17 < lVar11) {
                uVar12 = uVar10;
              }
              uVar10 = uVar12;
              if ((long)uVar17 < 0) {
                uVar10 = 0;
              }
              break;
            case STBIR_EDGE_REFLECT:
              if ((long)uVar17 < 0) {
                uVar10 = -uVar10;
                if (lVar11 <= (long)uVar17) {
                  uVar10 = iVar22 - 1U;
                }
              }
              else if ((lVar11 <= (long)uVar17) &&
                      (uVar10 = ~uVar10 + (int)(lVar11 * 2), lVar11 * 2 <= (long)uVar17)) {
                uVar10 = 0;
              }
              break;
            case STBIR_EDGE_WRAP:
              uVar12 = (uint)((long)((ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 |
                                    uVar17 & 0xffffffff) % (long)iVar22);
              uVar10 = uVar12;
              if (((long)uVar17 < 0) && (uVar10 = iVar22 + uVar12, uVar12 == 0)) {
                uVar10 = uVar12;
              }
              break;
            case STBIR_EDGE_ZERO:
              uVar10 = 0;
              break;
            default:
              goto switchD_001380aa_default;
            }
          }
          if (0 < (int)uVar1) {
            uVar23 = 0;
            do {
              pfVar15[uVar23] =
                   (float)*(byte *)((long)pvVar7 + uVar23 + (int)(uVar10 * uVar1) + lVar13) / 255.0;
              uVar23 = uVar23 + 1;
            } while (uVar14 != uVar23);
          }
          uVar17 = uVar17 + 1;
          pfVar15 = pfVar15 + lVar20;
        } while (iVar18 != (int)uVar17);
      }
      break;
    case 1:
      if (iVar18 != iVar8 && SBORROW4(iVar18,iVar8) == iVar18 + iVar3 < 0) {
        uVar17 = (ulong)iVar8;
        pfVar15 = pfVar6 + lVar20 * uVar17 + lVar19;
        do {
          uVar10 = (uint)uVar17;
          if ((long)uVar17 < 0 || lVar11 <= (long)uVar17) {
            switch(sVar4) {
            case STBIR_EDGE_CLAMP:
              uVar12 = iVar22 - 1U;
              if ((long)uVar17 < lVar11) {
                uVar12 = uVar10;
              }
              uVar10 = uVar12;
              if ((long)uVar17 < 0) {
                uVar10 = 0;
              }
              break;
            case STBIR_EDGE_REFLECT:
              if ((long)uVar17 < 0) {
                uVar10 = -uVar10;
                if (lVar11 <= (long)uVar17) {
                  uVar10 = iVar22 - 1U;
                }
              }
              else if (lVar11 <= (long)uVar17) {
                uVar10 = ~uVar10 + (int)(lVar11 * 2);
                if (lVar11 * 2 <= (long)uVar17) {
                  uVar10 = 0;
                }
              }
              break;
            case STBIR_EDGE_WRAP:
              uVar12 = (uint)((long)((ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 |
                                    uVar17 & 0xffffffff) % (long)iVar22);
              uVar10 = uVar12;
              if (((long)uVar17 < 0) && (uVar10 = iVar22 + uVar12, uVar12 == 0)) {
                uVar10 = uVar12;
              }
              break;
            case STBIR_EDGE_ZERO:
              uVar10 = 0;
              break;
            default:
              goto switchD_001380aa_default;
            }
          }
          if (0 < (int)uVar1) {
            uVar23 = 0;
            do {
              pfVar15[uVar23] =
                   stbir__srgb_uchar_to_linear_float
                   [*(byte *)((long)pvVar7 + uVar23 + (int)(uVar1 * uVar10) + lVar13)];
              uVar23 = uVar23 + 1;
            } while (uVar14 != uVar23);
          }
          if ((stbir_info->flags & 2) == 0) {
            pfVar6[lVar19 + lVar9 + uVar17 * lVar20] =
                 (float)*(byte *)((long)pvVar7 + (int)(uVar1 * uVar10) + lVar9 + lVar13) / 255.0;
          }
          uVar17 = uVar17 + 1;
          pfVar15 = pfVar15 + lVar20;
        } while (iVar18 != (int)uVar17);
      }
      break;
    case 2:
      if (iVar18 != iVar8 && SBORROW4(iVar18,iVar8) == iVar18 + iVar3 < 0) {
        uVar17 = (ulong)iVar8;
        pfVar15 = pfVar6 + lVar20 * uVar17 + lVar19;
        do {
          uVar10 = (uint)uVar17;
          if ((long)uVar17 < 0 || lVar11 <= (long)uVar17) {
            switch(sVar4) {
            case STBIR_EDGE_CLAMP:
              uVar12 = iVar22 - 1U;
              if ((long)uVar17 < lVar11) {
                uVar12 = uVar10;
              }
              uVar10 = uVar12;
              if ((long)uVar17 < 0) {
                uVar10 = 0;
              }
              break;
            case STBIR_EDGE_REFLECT:
              if ((long)uVar17 < 0) {
                uVar10 = -uVar10;
                if (lVar11 <= (long)uVar17) {
                  uVar10 = iVar22 - 1U;
                }
              }
              else if ((lVar11 <= (long)uVar17) &&
                      (uVar10 = ~uVar10 + (int)(lVar11 * 2), lVar11 * 2 <= (long)uVar17)) {
                uVar10 = 0;
              }
              break;
            case STBIR_EDGE_WRAP:
              uVar12 = (uint)((long)((ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 |
                                    uVar17 & 0xffffffff) % (long)iVar22);
              uVar10 = uVar12;
              if (((long)uVar17 < 0) && (uVar10 = iVar22 + uVar12, uVar12 == 0)) {
                uVar10 = uVar12;
              }
              break;
            case STBIR_EDGE_ZERO:
              uVar10 = 0;
              break;
            default:
              goto switchD_001380aa_default;
            }
          }
          if (0 < (int)uVar1) {
            uVar23 = 0;
            do {
              pfVar15[uVar23] =
                   (float)*(ushort *)
                           ((long)pvVar7 + uVar23 * 2 + (long)(int)(uVar10 * uVar1) * 2 + lVar13) /
                   65535.0;
              uVar23 = uVar23 + 1;
            } while (uVar14 != uVar23);
          }
          uVar17 = uVar17 + 1;
          pfVar15 = pfVar15 + lVar20;
        } while (iVar18 != (int)uVar17);
      }
      break;
    case 3:
      if (iVar18 != iVar8 && SBORROW4(iVar18,iVar8) == iVar18 + iVar3 < 0) {
        uVar17 = (ulong)iVar8;
        pfVar15 = pfVar6 + lVar20 * uVar17 + lVar19;
        do {
          uVar10 = (uint)uVar17;
          if ((long)uVar17 < 0 || lVar11 <= (long)uVar17) {
            switch(sVar4) {
            case STBIR_EDGE_CLAMP:
              uVar12 = iVar22 - 1U;
              if ((long)uVar17 < lVar11) {
                uVar12 = uVar10;
              }
              uVar10 = uVar12;
              if ((long)uVar17 < 0) {
                uVar10 = 0;
              }
              break;
            case STBIR_EDGE_REFLECT:
              if ((long)uVar17 < 0) {
                uVar10 = -uVar10;
                if (lVar11 <= (long)uVar17) {
                  uVar10 = iVar22 - 1U;
                }
              }
              else if (lVar11 <= (long)uVar17) {
                uVar10 = ~uVar10 + (int)(lVar11 * 2);
                if (lVar11 * 2 <= (long)uVar17) {
                  uVar10 = 0;
                }
              }
              break;
            case STBIR_EDGE_WRAP:
              uVar12 = (uint)((long)((ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 |
                                    uVar17 & 0xffffffff) % (long)iVar22);
              uVar10 = uVar12;
              if (((long)uVar17 < 0) && (uVar10 = iVar22 + uVar12, uVar12 == 0)) {
                uVar10 = uVar12;
              }
              break;
            case STBIR_EDGE_ZERO:
              uVar10 = 0;
              break;
            default:
              goto switchD_001380aa_default;
            }
          }
          if (0 < (int)uVar1) {
            uVar23 = 0;
            do {
              fVar24 = (float)*(ushort *)
                               ((long)pvVar7 + uVar23 * 2 + (long)(int)(uVar1 * uVar10) * 2 + lVar13
                               ) / 65535.0;
              if (fVar24 <= 0.04045) {
                fVar24 = fVar24 / 12.92;
              }
              else {
                fVar24 = powf((fVar24 + 0.055) / 1.055,2.4);
              }
              pfVar15[uVar23] = fVar24;
              uVar23 = uVar23 + 1;
            } while (uVar14 != uVar23);
          }
          if ((stbir_info->flags & 2) == 0) {
            pfVar6[lVar19 + lVar9 + uVar17 * lVar20] =
                 (float)*(ushort *)((long)pvVar7 + (long)(int)(uVar1 * uVar10 + uVar2) * 2 + lVar13)
                 / 65535.0;
          }
          uVar17 = uVar17 + 1;
          pfVar15 = pfVar15 + lVar20;
        } while (iVar18 != (int)uVar17);
      }
      break;
    case 4:
      if (iVar18 != iVar8 && SBORROW4(iVar18,iVar8) == iVar18 + iVar3 < 0) {
        uVar17 = (ulong)iVar8;
        pfVar15 = pfVar6 + lVar20 * uVar17 + lVar19;
        do {
          uVar10 = (uint)uVar17;
          if ((long)uVar17 < 0 || lVar11 <= (long)uVar17) {
            switch(sVar4) {
            case STBIR_EDGE_CLAMP:
              uVar12 = iVar22 - 1U;
              if ((long)uVar17 < lVar11) {
                uVar12 = uVar10;
              }
              uVar10 = uVar12;
              if ((long)uVar17 < 0) {
                uVar10 = 0;
              }
              break;
            case STBIR_EDGE_REFLECT:
              if ((long)uVar17 < 0) {
                uVar10 = -uVar10;
                if (lVar11 <= (long)uVar17) {
                  uVar10 = iVar22 - 1U;
                }
              }
              else if ((lVar11 <= (long)uVar17) &&
                      (uVar10 = ~uVar10 + (int)(lVar11 * 2), lVar11 * 2 <= (long)uVar17)) {
                uVar10 = 0;
              }
              break;
            case STBIR_EDGE_WRAP:
              uVar12 = (uint)((long)((ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 |
                                    uVar17 & 0xffffffff) % (long)iVar22);
              uVar10 = uVar12;
              if (((long)uVar17 < 0) && (uVar10 = iVar22 + uVar12, uVar12 == 0)) {
                uVar10 = uVar12;
              }
              break;
            case STBIR_EDGE_ZERO:
              uVar10 = 0;
              break;
            default:
              goto switchD_001380aa_default;
            }
          }
          if (0 < (int)uVar1) {
            uVar23 = 0;
            do {
              pfVar15[uVar23] =
                   (float)((double)*(uint *)((long)pvVar7 +
                                            uVar23 * 4 + (long)(int)(uVar10 * uVar1) * 4 + lVar13) /
                          4294967295.0);
              uVar23 = uVar23 + 1;
            } while (uVar14 != uVar23);
          }
          uVar17 = uVar17 + 1;
          pfVar15 = pfVar15 + lVar20;
        } while (iVar18 != (int)uVar17);
      }
      break;
    case 5:
      if (iVar18 != iVar8 && SBORROW4(iVar18,iVar8) == iVar18 + iVar3 < 0) {
        uVar17 = (ulong)iVar8;
        pfVar15 = pfVar6 + lVar20 * uVar17 + lVar19;
        do {
          uVar10 = (uint)uVar17;
          if ((long)uVar17 < 0 || lVar11 <= (long)uVar17) {
            switch(sVar4) {
            case STBIR_EDGE_CLAMP:
              uVar12 = iVar22 - 1U;
              if ((long)uVar17 < lVar11) {
                uVar12 = uVar10;
              }
              uVar10 = uVar12;
              if ((long)uVar17 < 0) {
                uVar10 = 0;
              }
              break;
            case STBIR_EDGE_REFLECT:
              if ((long)uVar17 < 0) {
                uVar10 = -uVar10;
                if (lVar11 <= (long)uVar17) {
                  uVar10 = iVar22 - 1U;
                }
              }
              else if (lVar11 <= (long)uVar17) {
                uVar10 = ~uVar10 + (int)(lVar11 * 2);
                if (lVar11 * 2 <= (long)uVar17) {
                  uVar10 = 0;
                }
              }
              break;
            case STBIR_EDGE_WRAP:
              uVar12 = (uint)((long)((ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 |
                                    uVar17 & 0xffffffff) % (long)iVar22);
              uVar10 = uVar12;
              if (((long)uVar17 < 0) && (uVar10 = iVar22 + uVar12, uVar12 == 0)) {
                uVar10 = uVar12;
              }
              break;
            case STBIR_EDGE_ZERO:
              uVar10 = 0;
              break;
            default:
              goto switchD_001380aa_default;
            }
          }
          if (0 < (int)uVar1) {
            uVar23 = 0;
            do {
              fVar24 = (float)((double)*(uint *)((long)pvVar7 +
                                                uVar23 * 4 +
                                                (long)(int)(uVar1 * uVar10) * 4 + lVar13) /
                              4294967295.0);
              if (fVar24 <= 0.04045) {
                fVar24 = fVar24 / 12.92;
              }
              else {
                fVar24 = powf((fVar24 + 0.055) / 1.055,2.4);
              }
              pfVar15[uVar23] = fVar24;
              uVar23 = uVar23 + 1;
            } while (uVar14 != uVar23);
          }
          if ((stbir_info->flags & 2) == 0) {
            pfVar6[lVar19 + lVar9 + uVar17 * lVar20] =
                 (float)((double)*(uint *)((long)pvVar7 +
                                          (long)(int)(uVar1 * uVar10 + uVar2) * 4 + lVar13) /
                        4294967295.0);
          }
          uVar17 = uVar17 + 1;
          pfVar15 = pfVar15 + lVar20;
        } while (iVar18 != (int)uVar17);
      }
      break;
    case 6:
      if (iVar18 != iVar8 && SBORROW4(iVar18,iVar8) == iVar18 + iVar3 < 0) {
        uVar17 = (ulong)iVar8;
        pfVar15 = pfVar6 + lVar20 * uVar17 + lVar19;
        do {
          uVar10 = (uint)uVar17;
          if ((long)uVar17 < 0 || lVar11 <= (long)uVar17) {
            switch(sVar4) {
            case STBIR_EDGE_CLAMP:
              uVar12 = iVar22 - 1U;
              if ((long)uVar17 < lVar11) {
                uVar12 = uVar10;
              }
              uVar10 = uVar12;
              if ((long)uVar17 < 0) {
                uVar10 = 0;
              }
              break;
            case STBIR_EDGE_REFLECT:
              if ((long)uVar17 < 0) {
                uVar10 = -uVar10;
                if (lVar11 <= (long)uVar17) {
                  uVar10 = iVar22 - 1U;
                }
              }
              else if ((lVar11 <= (long)uVar17) &&
                      (uVar10 = ~uVar10 + (int)(lVar11 * 2), lVar11 * 2 <= (long)uVar17)) {
                uVar10 = 0;
              }
              break;
            case STBIR_EDGE_WRAP:
              uVar12 = (uint)((long)((ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 |
                                    uVar17 & 0xffffffff) % (long)iVar22);
              uVar10 = uVar12;
              if (((long)uVar17 < 0) && (uVar10 = iVar22 + uVar12, uVar12 == 0)) {
                uVar10 = uVar12;
              }
              break;
            case STBIR_EDGE_ZERO:
              uVar10 = 0;
              break;
            default:
              goto switchD_001380aa_default;
            }
          }
          if (0 < (int)uVar1) {
            uVar23 = 0;
            do {
              pfVar15[uVar23] =
                   *(float *)((long)pvVar7 + uVar23 * 4 + (long)(int)(uVar10 * uVar1) * 4 + lVar13);
              uVar23 = uVar23 + 1;
            } while (uVar14 != uVar23);
          }
          uVar17 = uVar17 + 1;
          pfVar15 = pfVar15 + lVar20;
        } while (iVar18 != (int)uVar17);
      }
      break;
    case 7:
      if (iVar18 != iVar8 && SBORROW4(iVar18,iVar8) == iVar18 + iVar3 < 0) {
        uVar17 = (ulong)iVar8;
        pfVar15 = pfVar6 + lVar20 * uVar17 + lVar19;
        do {
          uVar10 = (uint)uVar17;
          if ((long)uVar17 < 0 || lVar11 <= (long)uVar17) {
            switch(sVar4) {
            case STBIR_EDGE_CLAMP:
              uVar12 = iVar22 - 1U;
              if ((long)uVar17 < lVar11) {
                uVar12 = uVar10;
              }
              uVar10 = uVar12;
              if ((long)uVar17 < 0) {
                uVar10 = 0;
              }
              break;
            case STBIR_EDGE_REFLECT:
              if ((long)uVar17 < 0) {
                uVar10 = -uVar10;
                if (lVar11 <= (long)uVar17) {
                  uVar10 = iVar22 - 1U;
                }
              }
              else if (lVar11 <= (long)uVar17) {
                uVar10 = ~uVar10 + (int)(lVar11 * 2);
                if (lVar11 * 2 <= (long)uVar17) {
                  uVar10 = 0;
                }
              }
              break;
            case STBIR_EDGE_WRAP:
              uVar12 = (uint)((long)((ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 |
                                    uVar17 & 0xffffffff) % (long)iVar22);
              uVar10 = uVar12;
              if (((long)uVar17 < 0) && (uVar10 = iVar22 + uVar12, uVar12 == 0)) {
                uVar10 = uVar12;
              }
              break;
            case STBIR_EDGE_ZERO:
              uVar10 = 0;
              break;
            default:
              goto switchD_001380aa_default;
            }
          }
          if (0 < (int)uVar1) {
            uVar23 = 0;
            do {
              fVar24 = *(float *)((long)pvVar7 +
                                 uVar23 * 4 + (long)(int)(uVar1 * uVar10) * 4 + lVar13);
              if (fVar24 <= 0.04045) {
                fVar24 = fVar24 / 12.92;
              }
              else {
                fVar24 = powf((fVar24 + 0.055) / 1.055,2.4);
              }
              pfVar15[uVar23] = fVar24;
              uVar23 = uVar23 + 1;
            } while (uVar14 != uVar23);
          }
          if ((stbir_info->flags & 2) == 0) {
            pfVar6[lVar19 + lVar9 + uVar17 * lVar20] =
                 *(float *)((long)pvVar7 + (long)(int)(uVar1 * uVar10 + uVar2) * 4 + lVar13);
          }
          uVar17 = uVar17 + 1;
          pfVar15 = pfVar15 + lVar20;
        } while (iVar18 != (int)uVar17);
      }
    }
    if ((stbir_info->flags & 1) == 0) {
      lVar11 = -(long)stbir_info->horizontal_filter_pixel_margin;
      if ((int)lVar11 < iVar18) {
        sVar5 = stbir_info->type;
        pfVar15 = pfVar6 + (lVar19 - stbir_info->horizontal_filter_pixel_margin * lVar20);
        do {
          fVar24 = pfVar6[lVar19 + lVar9 + lVar11 * lVar20];
          if (sVar5 != STBIR_TYPE_FLOAT) {
            fVar24 = fVar24 + 8.271806e-25;
            pfVar6[lVar19 + lVar9 + lVar11 * lVar20] = fVar24;
          }
          if (0 < (int)uVar1) {
            uVar17 = 0;
            do {
              if (uVar2 != uVar17) {
                pfVar15[uVar17] = pfVar15[uVar17] * fVar24;
              }
              uVar17 = uVar17 + 1;
            } while (uVar14 != uVar17);
          }
          lVar11 = lVar11 + 1;
          pfVar15 = pfVar15 + lVar20;
        } while (iVar18 != (int)lVar11);
      }
    }
    if (sVar4 == STBIR_EDGE_ZERO) {
      lVar9 = (long)stbir_info->horizontal_filter_pixel_margin;
      if (0 < lVar9) {
        iVar21 = -(stbir_info->horizontal_filter_pixel_margin * uVar1);
        do {
          if (0 < (int)uVar1) {
            memset(pfVar6 + lVar19 + iVar21,0,uVar14 * 4);
          }
          iVar21 = iVar21 + uVar1;
          lVar9 = lVar9 + -1;
        } while (lVar9 != 0);
      }
      if (0 < iVar3) {
        iVar21 = iVar22 * uVar1;
        do {
          if (0 < (int)uVar1) {
            memset(pfVar6 + lVar19 + iVar21,0,uVar14 * 4);
          }
          iVar22 = iVar22 + 1;
          iVar21 = iVar21 + uVar1;
        } while (iVar22 < iVar18);
      }
    }
  }
  return;
}

Assistant:

static void stbir__decode_scanline(stbir__info* stbir_info, int n)
{
    int c;
    int channels = stbir_info->channels;
    int alpha_channel = stbir_info->alpha_channel;
    int type = stbir_info->type;
    int colorspace = stbir_info->colorspace;
    int input_w = stbir_info->input_w;
    size_t input_stride_bytes = stbir_info->input_stride_bytes;
    float* decode_buffer = stbir__get_decode_buffer(stbir_info);
    stbir_edge edge_horizontal = stbir_info->edge_horizontal;
    stbir_edge edge_vertical = stbir_info->edge_vertical;
    size_t in_buffer_row_offset = stbir__edge_wrap(edge_vertical, n, stbir_info->input_h) * input_stride_bytes;
    const void* input_data = (char *) stbir_info->input_data + in_buffer_row_offset;
    int max_x = input_w + stbir_info->horizontal_filter_pixel_margin;
    int decode = STBIR__DECODE(type, colorspace);

    int x = -stbir_info->horizontal_filter_pixel_margin;

    // special handling for STBIR_EDGE_ZERO because it needs to return an item that doesn't appear in the input,
    // and we want to avoid paying overhead on every pixel if not STBIR_EDGE_ZERO
    if (edge_vertical == STBIR_EDGE_ZERO && (n < 0 || n >= stbir_info->input_h))
    {
        for (; x < max_x; x++)
            for (c = 0; c < channels; c++)
                decode_buffer[x*channels + c] = 0;
        return;
    }

    switch (decode)
    {
    case STBIR__DECODE(STBIR_TYPE_UINT8, STBIR_COLORSPACE_LINEAR):
        for (; x < max_x; x++)
        {
            int decode_pixel_index = x * channels;
            int input_pixel_index = stbir__edge_wrap(edge_horizontal, x, input_w) * channels;
            for (c = 0; c < channels; c++)
                decode_buffer[decode_pixel_index + c] = ((float)((const unsigned char*)input_data)[input_pixel_index + c]) / stbir__max_uint8_as_float;
        }
        break;

    case STBIR__DECODE(STBIR_TYPE_UINT8, STBIR_COLORSPACE_SRGB):
        for (; x < max_x; x++)
        {
            int decode_pixel_index = x * channels;
            int input_pixel_index = stbir__edge_wrap(edge_horizontal, x, input_w) * channels;
            for (c = 0; c < channels; c++)
                decode_buffer[decode_pixel_index + c] = stbir__srgb_uchar_to_linear_float[((const unsigned char*)input_data)[input_pixel_index + c]];

            if (!(stbir_info->flags&STBIR_FLAG_ALPHA_USES_COLORSPACE))
                decode_buffer[decode_pixel_index + alpha_channel] = ((float)((const unsigned char*)input_data)[input_pixel_index + alpha_channel]) / stbir__max_uint8_as_float;
        }
        break;

    case STBIR__DECODE(STBIR_TYPE_UINT16, STBIR_COLORSPACE_LINEAR):
        for (; x < max_x; x++)
        {
            int decode_pixel_index = x * channels;
            int input_pixel_index = stbir__edge_wrap(edge_horizontal, x, input_w) * channels;
            for (c = 0; c < channels; c++)
                decode_buffer[decode_pixel_index + c] = ((float)((const unsigned short*)input_data)[input_pixel_index + c]) / stbir__max_uint16_as_float;
        }
        break;

    case STBIR__DECODE(STBIR_TYPE_UINT16, STBIR_COLORSPACE_SRGB):
        for (; x < max_x; x++)
        {
            int decode_pixel_index = x * channels;
            int input_pixel_index = stbir__edge_wrap(edge_horizontal, x, input_w) * channels;
            for (c = 0; c < channels; c++)
                decode_buffer[decode_pixel_index + c] = stbir__srgb_to_linear(((float)((const unsigned short*)input_data)[input_pixel_index + c]) / stbir__max_uint16_as_float);

            if (!(stbir_info->flags&STBIR_FLAG_ALPHA_USES_COLORSPACE))
                decode_buffer[decode_pixel_index + alpha_channel] = ((float)((const unsigned short*)input_data)[input_pixel_index + alpha_channel]) / stbir__max_uint16_as_float;
        }
        break;

    case STBIR__DECODE(STBIR_TYPE_UINT32, STBIR_COLORSPACE_LINEAR):
        for (; x < max_x; x++)
        {
            int decode_pixel_index = x * channels;
            int input_pixel_index = stbir__edge_wrap(edge_horizontal, x, input_w) * channels;
            for (c = 0; c < channels; c++)
                decode_buffer[decode_pixel_index + c] = (float)(((double)((const unsigned int*)input_data)[input_pixel_index + c]) / stbir__max_uint32_as_float);
        }
        break;

    case STBIR__DECODE(STBIR_TYPE_UINT32, STBIR_COLORSPACE_SRGB):
        for (; x < max_x; x++)
        {
            int decode_pixel_index = x * channels;
            int input_pixel_index = stbir__edge_wrap(edge_horizontal, x, input_w) * channels;
            for (c = 0; c < channels; c++)
                decode_buffer[decode_pixel_index + c] = stbir__srgb_to_linear((float)(((double)((const unsigned int*)input_data)[input_pixel_index + c]) / stbir__max_uint32_as_float));

            if (!(stbir_info->flags&STBIR_FLAG_ALPHA_USES_COLORSPACE))
                decode_buffer[decode_pixel_index + alpha_channel] = (float)(((double)((const unsigned int*)input_data)[input_pixel_index + alpha_channel]) / stbir__max_uint32_as_float);
        }
        break;

    case STBIR__DECODE(STBIR_TYPE_FLOAT, STBIR_COLORSPACE_LINEAR):
        for (; x < max_x; x++)
        {
            int decode_pixel_index = x * channels;
            int input_pixel_index = stbir__edge_wrap(edge_horizontal, x, input_w) * channels;
            for (c = 0; c < channels; c++)
                decode_buffer[decode_pixel_index + c] = ((const float*)input_data)[input_pixel_index + c];
        }
        break;

    case STBIR__DECODE(STBIR_TYPE_FLOAT, STBIR_COLORSPACE_SRGB):
        for (; x < max_x; x++)
        {
            int decode_pixel_index = x * channels;
            int input_pixel_index = stbir__edge_wrap(edge_horizontal, x, input_w) * channels;
            for (c = 0; c < channels; c++)
                decode_buffer[decode_pixel_index + c] = stbir__srgb_to_linear(((const float*)input_data)[input_pixel_index + c]);

            if (!(stbir_info->flags&STBIR_FLAG_ALPHA_USES_COLORSPACE))
                decode_buffer[decode_pixel_index + alpha_channel] = ((const float*)input_data)[input_pixel_index + alpha_channel];
        }

        break;

    default:
        STBIR_ASSERT(!"Unknown type/colorspace/channels combination.");
        break;
    }

    if (!(stbir_info->flags & STBIR_FLAG_ALPHA_PREMULTIPLIED))
    {
        for (x = -stbir_info->horizontal_filter_pixel_margin; x < max_x; x++)
        {
            int decode_pixel_index = x * channels;

            // If the alpha value is 0 it will clobber the color values. Make sure it's not.
            float alpha = decode_buffer[decode_pixel_index + alpha_channel];
#ifndef STBIR_NO_ALPHA_EPSILON
            if (stbir_info->type != STBIR_TYPE_FLOAT) {
                alpha += STBIR_ALPHA_EPSILON;
                decode_buffer[decode_pixel_index + alpha_channel] = alpha;
            }
#endif
            for (c = 0; c < channels; c++)
            {
                if (c == alpha_channel)
                    continue;

                decode_buffer[decode_pixel_index + c] *= alpha;
            }
        }
    }

    if (edge_horizontal == STBIR_EDGE_ZERO)
    {
        for (x = -stbir_info->horizontal_filter_pixel_margin; x < 0; x++)
        {
            for (c = 0; c < channels; c++)
                decode_buffer[x*channels + c] = 0;
        }
        for (x = input_w; x < max_x; x++)
        {
            for (c = 0; c < channels; c++)
                decode_buffer[x*channels + c] = 0;
        }
    }
}